

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

bool __thiscall
cmMakefileTargetGenerator::CheckUseResponseFileForLibraries
          (cmMakefileTargetGenerator *this,string *l)

{
  bool bVar1;
  ulong uVar2;
  cmValue local_78;
  cmValue val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string responseVar;
  string *l_local;
  cmMakefileTargetGenerator *this_local;
  
  responseVar.field_2._8_8_ = l;
  std::operator+(&local_60,"CMAKE_",l);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,"_USE_RESPONSE_FILE_FOR_LIBRARIES");
  std::__cxx11::string::~string((string *)&local_60);
  local_78 = cmMakefile::GetDefinition
                       ((this->super_cmCommonTargetGenerator).Makefile,(string *)local_40);
  bVar1 = cmValue::operator_cast_to_bool(&local_78);
  if (bVar1) {
    cmValue::operator->[abi_cxx11_(&local_78);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      this_local._7_1_ = cmValue::IsOn(&local_78);
      goto LAB_00980b13;
    }
  }
  this_local._7_1_ = false;
LAB_00980b13:
  std::__cxx11::string::~string((string *)local_40);
  return this_local._7_1_;
}

Assistant:

bool cmMakefileTargetGenerator::CheckUseResponseFileForLibraries(
  std::string const& l) const
{
  // Check for an explicit setting one way or the other.
  std::string const responseVar =
    "CMAKE_" + l + "_USE_RESPONSE_FILE_FOR_LIBRARIES";
  if (cmValue val = this->Makefile->GetDefinition(responseVar)) {
    if (!val->empty()) {
      return val.IsOn();
    }
  }

  // We do not need a response file for libraries.
  return false;
}